

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_test.cpp
# Opt level: O3

void __thiscall
jhu::thrax::TreeTests_TooFewRightParens_Test::TestBody(TreeTests_TooFewRightParens_Test *this)

{
  bool bVar1;
  string_view line;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertHelper local_28;
  Tree local_20;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    line._M_str = "(ROOT";
    line._M_len = 5;
    readTree(&local_20,line);
    if (local_20.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_20.
                      super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_20.
                            super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_20.
                            super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  testing::Message::Message((Message *)&local_30);
  testing::internal::AssertHelper::AssertHelper
            (&local_28,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/tree_test.cpp"
             ,0x28,
             "Expected: readTree(\"(ROOT\") throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
  testing::internal::AssertHelper::~AssertHelper(&local_28);
  if (local_30.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_30.ptr_ + 8))();
    }
  }
  return;
}

Assistant:

TEST(TreeTests, TooFewRightParens) {
 EXPECT_THROW(readTree("(ROOT"), std::invalid_argument);
}